

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void lowbd_fwd_txfm2d_32x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  int8_t *piVar8;
  int16_t *piVar9;
  undefined7 in_register_00000009;
  long lVar10;
  longlong *plVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  longlong *plVar16;
  bool bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m256i buf0 [32];
  __m256i buf1 [128];
  undefined8 uStack_1480;
  uint local_1478;
  uint local_1474;
  code *local_1470 [2];
  longlong local_1460 [256];
  longlong local_c60 [390];
  
  piVar8 = av1_fwd_txfm_shift_ls[3];
  uVar13 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  local_1470[0] = *(code **)((long)col_txfm16x32_arr + uVar13);
  uVar14 = 0xbeaf >> (tx_type & 0x1f);
  local_1470[1] = *(code **)((long)row_txfm16x32_arr + uVar13);
  uVar12 = 0x7f1f >> (tx_type & 0x1f);
  local_1478 = CONCAT31((int3)(uVar14 >> 8),(byte)uVar14 | 0xf < tx_type);
  local_1474 = CONCAT31((int3)(uVar12 >> 8),(byte)uVar12 | 0xf < tx_type);
  uStack_1480._4_4_ = 0xc;
  lVar15 = 0;
  do {
    if ((local_1478 & 1) == 0) {
      lVar10 = 0x400;
      piVar9 = input;
      do {
        uVar2 = *(undefined8 *)(piVar9 + 4);
        uVar3 = *(undefined8 *)(piVar9 + 8);
        uVar4 = *(undefined8 *)(piVar9 + 0xc);
        *(undefined8 *)((long)&uStack_1480 + lVar10) = *(undefined8 *)piVar9;
        *(undefined8 *)((long)&local_1478 + lVar10) = uVar2;
        *(undefined8 *)((long)local_1470 + lVar10) = uVar3;
        *(undefined8 *)((long)local_1470 + lVar10 + 8) = uVar4;
        piVar9 = piVar9 + stride;
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != 0);
    }
    else {
      lVar10 = 0;
      piVar9 = input;
      do {
        uVar2 = *(undefined8 *)(piVar9 + 4);
        uVar3 = *(undefined8 *)(piVar9 + 8);
        uVar4 = *(undefined8 *)(piVar9 + 0xc);
        *(undefined8 *)((long)local_1460 + lVar10) = *(undefined8 *)piVar9;
        *(undefined8 *)((long)local_1460 + lVar10 + 8) = uVar2;
        *(undefined8 *)((long)local_1460 + lVar10 + 0x10) = uVar3;
        *(undefined8 *)((long)local_1460 + lVar10 + 0x18) = uVar4;
        lVar10 = lVar10 + 0x20;
        piVar9 = piVar9 + stride;
      } while (lVar10 != 0x400);
    }
    bVar1 = *piVar8;
    uVar12 = (uint)(char)bVar1;
    if ((int)uVar12 < 0) {
      auVar18._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar18._2_2_ = auVar18._0_2_;
      auVar18._4_2_ = auVar18._0_2_;
      auVar18._6_2_ = auVar18._0_2_;
      auVar18._8_2_ = auVar18._0_2_;
      auVar18._10_2_ = auVar18._0_2_;
      auVar18._12_2_ = auVar18._0_2_;
      auVar18._14_2_ = auVar18._0_2_;
      auVar18._16_2_ = auVar18._0_2_;
      auVar18._18_2_ = auVar18._0_2_;
      auVar18._20_2_ = auVar18._0_2_;
      auVar18._22_2_ = auVar18._0_2_;
      auVar18._24_2_ = auVar18._0_2_;
      auVar18._26_2_ = auVar18._0_2_;
      auVar18._28_2_ = auVar18._0_2_;
      auVar18._30_2_ = auVar18._0_2_;
      lVar10 = 0;
      do {
        auVar19 = vpaddsw_avx2(auVar18,*(undefined1 (*) [32])((long)local_1460 + lVar10));
        auVar19 = vpsraw_avx2(auVar19,ZEXT416(-uVar12));
        *(undefined1 (*) [32])((long)local_1460 + lVar10) = auVar19;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    else if (bVar1 != 0) {
      lVar10 = 0;
      do {
        auVar18 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1460 + lVar10),ZEXT416(uVar12));
        *(undefined1 (*) [32])((long)local_1460 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    (*local_1470[0])(local_1460,local_1460,uStack_1480._4_4_);
    bVar1 = piVar8[1];
    uVar12 = (uint)(char)bVar1;
    if ((int)uVar12 < 0) {
      auVar19._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar19._2_2_ = auVar19._0_2_;
      auVar19._4_2_ = auVar19._0_2_;
      auVar19._6_2_ = auVar19._0_2_;
      auVar19._8_2_ = auVar19._0_2_;
      auVar19._10_2_ = auVar19._0_2_;
      auVar19._12_2_ = auVar19._0_2_;
      auVar19._14_2_ = auVar19._0_2_;
      auVar19._16_2_ = auVar19._0_2_;
      auVar19._18_2_ = auVar19._0_2_;
      auVar19._20_2_ = auVar19._0_2_;
      auVar19._22_2_ = auVar19._0_2_;
      auVar19._24_2_ = auVar19._0_2_;
      auVar19._26_2_ = auVar19._0_2_;
      auVar19._28_2_ = auVar19._0_2_;
      auVar19._30_2_ = auVar19._0_2_;
      lVar10 = 0;
      do {
        auVar18 = vpaddsw_avx2(auVar19,*(undefined1 (*) [32])((long)local_1460 + lVar10));
        auVar18 = vpsraw_avx2(auVar18,ZEXT416(-uVar12));
        *(undefined1 (*) [32])((long)local_1460 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    else if (bVar1 != 0) {
      lVar10 = 0;
      do {
        auVar18 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1460 + lVar10),ZEXT416(uVar12));
        *(undefined1 (*) [32])((long)local_1460 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    transpose_16bit_16x16_avx2((__m256i *)local_1460,(__m256i *)(local_1460 + lVar15 * 0x40 + 0x80))
    ;
    transpose_16bit_16x16_avx2
              ((__m256i *)(local_1460 + 0x40),(__m256i *)(local_c60 + lVar15 * 0x40));
    input = input + 0x10;
    bVar17 = lVar15 == 0;
    lVar15 = lVar15 + 1;
  } while (bVar17);
  plVar16 = local_1460;
  lVar15 = 0;
  do {
    plVar16 = plVar16 + 0x80;
    if ((local_1474 & 1) == 0) {
      lVar10 = 0x400;
      plVar11 = plVar16;
      do {
        lVar5 = plVar11[1];
        lVar6 = plVar11[2];
        lVar7 = plVar11[3];
        *(longlong *)((long)&uStack_1480 + lVar10) = *plVar11;
        *(longlong *)((long)&local_1478 + lVar10) = lVar5;
        *(longlong *)((long)local_1470 + lVar10) = lVar6;
        *(longlong *)((long)local_1470 + lVar10 + 8) = lVar7;
        plVar11 = plVar11 + 4;
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != 0);
      plVar11 = local_1460;
    }
    else {
      plVar11 = local_1460 + lVar15 * 0x80 + 0x80;
    }
    (*local_1470[1])(plVar11,plVar11,0xc);
    bVar1 = piVar8[2];
    if ((char)bVar1 < '\0') {
      auVar20._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar20._2_2_ = auVar20._0_2_;
      auVar20._4_2_ = auVar20._0_2_;
      auVar20._6_2_ = auVar20._0_2_;
      auVar20._8_2_ = auVar20._0_2_;
      auVar20._10_2_ = auVar20._0_2_;
      auVar20._12_2_ = auVar20._0_2_;
      auVar20._14_2_ = auVar20._0_2_;
      auVar20._16_2_ = auVar20._0_2_;
      auVar20._18_2_ = auVar20._0_2_;
      auVar20._20_2_ = auVar20._0_2_;
      auVar20._22_2_ = auVar20._0_2_;
      auVar20._24_2_ = auVar20._0_2_;
      auVar20._26_2_ = auVar20._0_2_;
      auVar20._28_2_ = auVar20._0_2_;
      auVar20._30_2_ = auVar20._0_2_;
      lVar10 = 0;
      do {
        auVar18 = vpaddsw_avx2(auVar20,*(undefined1 (*) [32])((long)plVar11 + lVar10));
        auVar18 = vpsraw_avx2(auVar18,ZEXT416((uint)-(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar11 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    else if (bVar1 != 0) {
      lVar10 = 0;
      do {
        auVar18 = vpsllw_avx2(*(undefined1 (*) [32])((long)plVar11 + lVar10),
                              ZEXT416((uint)(int)(char)bVar1));
        *(undefined1 (*) [32])((long)plVar11 + lVar10) = auVar18;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x400);
    }
    lVar10 = 0;
    do {
      auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)plVar11 + lVar10));
      auVar19 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)plVar11 + lVar10 + 0x10));
      *(undefined1 (*) [32])(output + lVar10) = auVar18;
      *(undefined1 (*) [32])(output + lVar10 + 8) = auVar19;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x400);
    output = output + 0x10;
    bVar17 = lVar15 == 0;
    lVar15 = lVar15 + 1;
  } while (bVar17);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x32_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_32X32;
  __m256i buf0[32], buf1[128];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x32_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x32_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip_avx2(input + 16 * i, stride, buf0,
                                           height);
    } else {
      load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    }
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    transpose_16bit_16x16_avx2(buf0 + 0 * 16, buf1 + 0 * width + 16 * i);
    transpose_16bit_16x16_avx2(buf0 + 1 * 16, buf1 + 1 * width + 16 * i);
  }

  for (int i = 0; i < 2; i++) {
    __m256i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_avx2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w16_avx2(buf, output + i * 16, height, width);
  }
}